

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_entry.hxx
# Opt level: O1

ptr<log_entry> __thiscall nuraft::log_entry::deserialize(log_entry *this,buffer *buf)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  ptr<log_entry> pVar2;
  log_val_type t;
  ptr<buffer> data;
  ulong term;
  log_val_type local_42;
  undefined1 local_41;
  EVP_PKEY_CTX local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  ulong local_30;
  
  local_30 = buffer::get_ulong(buf);
  local_42 = buffer::get_byte(buf);
  buffer::copy(local_40,(EVP_PKEY_CTX *)buf);
  this->term_ = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<nuraft::log_entry,std::allocator<nuraft::log_entry>,unsigned_long&,std::shared_ptr<nuraft::buffer>&,nuraft::log_val_type&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->value_type_,(log_entry **)this,
             (allocator<nuraft::log_entry> *)&local_41,&local_30,
             (shared_ptr<nuraft::buffer> *)local_40,&local_42);
  _Var1._M_pi = extraout_RDX;
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    _Var1._M_pi = extraout_RDX_00;
  }
  pVar2.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  pVar2.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (ptr<log_entry>)pVar2.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static ptr<log_entry> deserialize(buffer& buf) {
        ulong term = buf.get_ulong();
        log_val_type t = static_cast<log_val_type>(buf.get_byte());
        ptr<buffer> data = buffer::copy(buf);
        return cs_new<log_entry>(term, data, t);
    }